

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O1

void Minisat::sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(int *array,uint size)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  int *__dest;
  
  while( true ) {
    if ((int)size < 0x10) {
      selectionSort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(array,size);
      return;
    }
    if (0x20 < (int)size) break;
    iVar2 = array[size >> 1];
    uVar24 = 0xffffffffffffffff;
    uVar12 = (ulong)size;
    while( true ) {
      uVar24 = (ulong)(int)uVar24;
      piVar10 = array + uVar24;
      do {
        uVar24 = uVar24 + 1;
        iVar3 = piVar10[1];
        piVar10 = piVar10 + 1;
      } while (iVar3 < iVar2);
      uVar12 = (ulong)(int)uVar12;
      do {
        lVar22 = uVar12 - 1;
        uVar12 = uVar12 - 1;
      } while (iVar2 < array[lVar22]);
      if ((long)uVar12 <= (long)uVar24) break;
      *piVar10 = array[lVar22];
      array[uVar12] = iVar3;
    }
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(array,uVar24 & 0xffffffff);
    size = size - (int)uVar24;
    array = piVar10;
  }
  uVar12 = (ulong)size;
  piVar10 = (int *)operator_new__(uVar12 * 4);
  uVar23 = 1;
  bVar7 = false;
  do {
    bVar8 = bVar7;
    __dest = array;
    array = piVar10;
    uVar6 = uVar23 * 2;
    lVar13 = (long)(int)uVar23;
    uVar24 = 0;
    lVar22 = lVar13;
    uVar21 = uVar6;
    do {
      uVar20 = uVar21;
      if ((long)uVar12 < (long)(int)uVar21) {
        uVar20 = size;
      }
      uVar1 = uVar24 + (long)(int)uVar6;
      uVar11 = (uint)uVar1;
      if ((int)size < (int)(uint)uVar1) {
        uVar11 = size;
      }
      uVar14 = lVar13 + uVar24;
      uVar18 = (uint)uVar14;
      uVar4 = uVar23 + uVar18;
      if ((int)size <= (int)(uVar23 + uVar18)) {
        uVar4 = size;
      }
      uVar9 = (uint)uVar24;
      uVar15 = uVar9;
      if (0 < (int)uVar23) {
        uVar16 = uVar24 & 0xffffffff;
        uVar19 = uVar14 & 0xffffffff;
        if ((long)uVar14 < (long)(int)uVar4) {
          do {
            iVar2 = __dest[(int)uVar16];
            iVar3 = __dest[(int)uVar19];
            iVar5 = iVar3;
            if (iVar2 < iVar3) {
              iVar5 = iVar2;
            }
            uVar15 = (int)uVar16 + (uint)(iVar2 < iVar3);
            uVar16 = (ulong)uVar15;
            uVar18 = (int)uVar19 + (uint)(iVar3 <= iVar2);
            uVar19 = (ulong)uVar18;
            array[uVar24] = iVar5;
            uVar24 = uVar24 + 1;
          } while (((long)(int)uVar15 < (long)uVar14) && ((int)uVar18 < (int)uVar4));
        }
      }
      uVar17 = (uint)uVar24;
      if ((long)(int)uVar15 < (long)uVar14) {
        memcpy(array + (int)uVar17,__dest + (int)uVar15,
               (ulong)((uVar9 + (uVar23 - 1)) - uVar15) * 4 + 4);
        uVar17 = (uVar17 + (int)lVar22) - uVar15;
      }
      if ((int)uVar18 < (int)uVar4) {
        memcpy(array + (int)uVar17,__dest + (int)uVar18,(ulong)(uVar11 + ~uVar18) * 4 + 4);
        uVar17 = (uVar20 + uVar17) - uVar18;
      }
      lVar22 = lVar22 + (int)uVar6;
      uVar21 = uVar21 + uVar6;
      uVar24 = uVar1;
    } while ((long)uVar1 < (long)(uVar12 - lVar13));
    if ((int)uVar17 < (int)size) {
      memcpy(array + (int)uVar17,__dest + (int)uVar17,(ulong)(~uVar17 + size) * 4 + 4);
    }
    piVar10 = __dest;
    uVar23 = uVar6;
    bVar7 = (bool)(bVar8 ^ 1);
  } while ((int)uVar6 < (int)size);
  if (!bVar8) {
    memcpy(__dest,array,uVar12 * 4);
    __dest = array;
  }
  if (__dest == (int *)0x0) {
    return;
  }
  operator_delete__(__dest);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}